

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::Write(CWriter *this,TryTableExpr *try_table_expr)

{
  bool bVar1;
  __type _Var2;
  reference pvVar3;
  reference c;
  pointer this_00;
  Newline local_af;
  CloseBrace local_ae;
  Newline local_ad;
  CloseBrace local_ac;
  Newline local_ab;
  CloseBrace local_aa;
  OpenBrace local_a9;
  string_view local_a8;
  __normal_iterator<const_wabt::TableCatch_*,_std::vector<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>_>
  local_90;
  __normal_iterator<const_wabt::TableCatch_*,_std::vector<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>_>
  local_88;
  __normal_iterator<const_wabt::TableCatch_*,_std::vector<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>_>
  local_80;
  const_iterator it;
  undefined1 local_70 [7];
  bool has_catch_all;
  LabelDecl local_50;
  Newline local_29;
  LabelName local_28;
  LabelName tlabel;
  size_t mark;
  TryTableExpr *try_table_expr_local;
  CWriter *this_local;
  
  tlabel.super_LocalName.name = (LocalName)BeginTry(this,&try_table_expr->block);
  LabelName::LocalName(&local_28,&(try_table_expr->block).label);
  (anonymous_namespace)::CWriter::
  Write<char_const(&)[27],wabt::(anonymous_namespace)::LabelName_const&,char_const(&)[16],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [27])"wasm_rt_set_unwind_target(",&local_28,
             (char (*) [16])"_outer_target);",&local_29);
  PopTryCatch(this);
  ResetTypeStack(this,(size_t)tlabel.super_LocalName.name);
  bVar1 = std::
          vector<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
          ::empty(&this->label_stack_);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!label_stack_.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                  ,0xdb5,"void wabt::(anonymous namespace)::CWriter::Write(const TryTableExpr &)");
  }
  pvVar3 = std::
           vector<wabt::(anonymous_namespace)::Label,_std::allocator<wabt::(anonymous_namespace)::Label>_>
           ::back(&this->label_stack_);
  _Var2 = std::operator==(pvVar3->name,&(try_table_expr->block).label);
  if (!_Var2) {
    __assert_fail("label_stack_.back().name == try_table_expr.block.label",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                  ,0xdb6,"void wabt::(anonymous namespace)::CWriter::Write(const TryTableExpr &)");
  }
  GetLocalName((string *)local_70,this,&(try_table_expr->block).label,true);
  LabelDecl::LabelDecl(&local_50,(string *)local_70);
  Write(this,&local_50);
  LabelDecl::~LabelDecl(&local_50);
  std::__cxx11::string::~string((string *)local_70);
  PopLabel(this);
  bVar1 = std::vector<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>::empty
                    (&try_table_expr->catches);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!try_table_expr.catches.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                  ,0xdba,"void wabt::(anonymous namespace)::CWriter::Write(const TryTableExpr &)");
  }
  it._M_current._7_1_ = 0;
  local_80._M_current =
       (TableCatch *)
       std::vector<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>::cbegin
                 (&try_table_expr->catches);
  do {
    local_88._M_current =
         (TableCatch *)
         std::vector<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>::cend
                   (&try_table_expr->catches);
    bVar1 = __gnu_cxx::operator!=(&local_80,&local_88);
    if (!bVar1) {
LAB_001f0725:
      if ((it._M_current._7_1_ & 1) == 0) {
        (anonymous_namespace)::CWriter::
        Write<char_const(&)[7],wabt::(anonymous_namespace)::OpenBrace>
                  ((CWriter *)this,(char (*) [7])" else ",&local_a9);
        WriteThrow(this);
        (anonymous_namespace)::CWriter::
        Write<wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
                  ((CWriter *)this,&local_aa,&local_ab);
      }
      (anonymous_namespace)::CWriter::
      Write<wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,&local_ac,&local_ad);
      (anonymous_namespace)::CWriter::
      Write<wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,&local_ae,&local_af);
      ResetTypeStack(this,(size_t)tlabel.super_LocalName.name);
      PushTypes(this,&(try_table_expr->block).decl.sig.result_types);
      return;
    }
    local_90._M_current =
         (TableCatch *)
         std::vector<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>::cbegin
                   (&try_table_expr->catches);
    bVar1 = __gnu_cxx::operator==(&local_80,&local_90);
    if (bVar1) {
      Write(this);
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a8," else ");
      Write(this,local_a8);
    }
    ResetTypeStack(this,(size_t)tlabel.super_LocalName.name);
    c = __gnu_cxx::
        __normal_iterator<const_wabt::TableCatch_*,_std::vector<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>_>
        ::operator*(&local_80);
    Write(this,c);
    this_00 = __gnu_cxx::
              __normal_iterator<const_wabt::TableCatch_*,_std::vector<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>_>
              ::operator->(&local_80);
    bVar1 = TableCatch::IsCatchAll(this_00);
    if (bVar1) {
      it._M_current._7_1_ = 1;
      goto LAB_001f0725;
    }
    __gnu_cxx::
    __normal_iterator<const_wabt::TableCatch_*,_std::vector<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>_>
    ::operator++(&local_80);
  } while( true );
}

Assistant:

void CWriter::Write(const TryTableExpr& try_table_expr) {
  const size_t mark = BeginTry(try_table_expr.block);

  /* exception has been thrown -- do we catch it? */

  const LabelName tlabel = LabelName(try_table_expr.block.label);

  Write("wasm_rt_set_unwind_target(", tlabel, "_outer_target);", Newline());
  PopTryCatch();

  ResetTypeStack(mark);
  assert(!label_stack_.empty());
  assert(label_stack_.back().name == try_table_expr.block.label);
  Write(LabelDecl(GetLocalName(try_table_expr.block.label, true)));
  PopLabel();

  assert(!try_table_expr.catches.empty());
  bool has_catch_all{};
  for (auto it = try_table_expr.catches.cbegin();
       it != try_table_expr.catches.cend(); ++it) {
    if (it == try_table_expr.catches.cbegin()) {
      Write(Newline());
    } else {
      Write(" else ");
    }
    ResetTypeStack(mark);
    Write(*it);
    if (it->IsCatchAll()) {
      has_catch_all = true;
      break;
    }
  }
  if (!has_catch_all) {
    /* if not caught, rethrow */
    Write(" else ", OpenBrace());
    WriteThrow();
    Write(CloseBrace(), Newline());
  }
  Write(CloseBrace(), Newline()); /* end of catch blocks */
  Write(CloseBrace(), Newline()); /* end of try-catch */

  ResetTypeStack(mark);
  PushTypes(try_table_expr.block.decl.sig.result_types);
}